

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::GetSuppressDevWarnings(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_29;
  string local_28;
  
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    std::__cxx11::string::string((string *)&local_28,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_29);
    val = cmState::GetCacheEntryValue(this_00,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    bVar1 = cmSystemTools::IsOn(val);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_29);
    bVar1 = cmMakefile::IsOn(mf,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return bVar1;
}

Assistant:

bool cmake::GetSuppressDevWarnings(cmMakefile const* mf)
{
  /*
   * The suppression CMake variable may be set in the CMake configuration file
   * itself, so we have to check what its set to in the makefile if we can.
   */
  if (mf)
    {
    return mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    return cmSystemTools::IsOn(cacheEntryValue);
    }
}